

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::push_arg<asmjit::X86Gp,int,asmjit::X86Gp>
               (X86Assembler *as,X86Gp *arg1,int args,X86Gp *args_1)

{
  uint32_t in_stack_ffffffffffffff5c;
  anon_union_16_7_ed616b9d_for_Operand__0 local_98;
  X86Gp *local_88;
  X86Gp *args_local_1;
  X86Gp *pXStack_78;
  int args_local;
  X86Gp *arg1_local;
  X86Assembler *as_local;
  X86Gp *local_60;
  X86Gp *local_58;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_50;
  X86Gp *local_48;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_40;
  X86Gp *local_38;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_30;
  X86Gp *local_28;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_20;
  X86Gp *local_18;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_10;
  
  local_50 = &local_98;
  local_98._packed[0].field_10 =
       (args_1->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_98._mem.field_2 =
       (args_1->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2;
  local_88 = args_1;
  args_local_1._4_4_ = args;
  pXStack_78 = arg1;
  arg1_local = (X86Gp *)as;
  local_58 = args_1;
  local_48 = args_1;
  local_40 = local_50;
  local_38 = args_1;
  local_30 = local_50;
  local_28 = args_1;
  local_20 = local_50;
  local_18 = args_1;
  local_10 = local_50;
  push_arg<int,asmjit::X86Gp>(as,args,(X86Gp *)&local_98._any);
  local_60 = arg1_local;
  as_local = (X86Assembler *)arg1;
  asmjit::CodeEmitter::emit((CodeEmitter *)arg1,in_stack_ffffffffffffff5c,(Operand_ *)0x18575e);
  return;
}

Assistant:

static void push_arg(asmjit::X86Assembler& as, T1 arg1, Ts... args)
{
	push_arg(as, args...);
	as.push(arg1);
}